

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool __thiscall
Fossilize::ConcurrentDatabase::has_entry(ConcurrentDatabase *this,ResourceTag tag,Hash hash)

{
  ExportedMetadataHeader *header;
  DatabaseInterface *pDVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  Hash local_20;
  
  uVar2 = (ulong)tag;
  header = ((this->super_DatabaseInterface).impl)->imported_concurrent_metadata;
  local_20 = hash;
  if (header != (ExportedMetadataHeader *)0x0) {
    bVar3 = find_entry_in_concurrent_metadata(header,tag,hash);
    return bVar3;
  }
  bVar3 = DatabaseInterface::test_resource_filter(&this->super_DatabaseInterface,tag,hash);
  if (bVar3) {
    sVar5 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&this->primed_hashes[uVar2]._M_h,&local_20);
    if (sVar5 != 0) {
      return true;
    }
    pDVar1 = (this->readonly_interface)._M_t.
             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if ((pDVar1 != (DatabaseInterface *)0x0) &&
       (iVar4 = (*pDVar1->_vptr_DatabaseInterface[5])(pDVar1,uVar2,local_20), (char)iVar4 != '\0'))
    {
      return true;
    }
    pDVar1 = (this->writeonly_interface)._M_t.
             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if (pDVar1 != (DatabaseInterface *)0x0) {
      iVar4 = (*pDVar1->_vptr_DatabaseInterface[5])(pDVar1,uVar2,local_20);
      return (bool)(char)iVar4;
    }
  }
  return false;
}

Assistant:

bool has_entry(ResourceTag tag, Hash hash) override
	{
		if (impl->imported_concurrent_metadata)
			return find_entry_in_concurrent_metadata(impl->imported_concurrent_metadata, tag, hash);

		if (!test_resource_filter(tag, hash))
			return false;

		if (primed_hashes[tag].count(hash))
			return true;

		// All threads must have called prepare and synchronized readonly_interface from that,
		// and from here on out readonly_interface is purely read-only, no need to lock just to check.
		if (readonly_interface && readonly_interface->has_entry(tag, hash))
			return true;

		return writeonly_interface && writeonly_interface->has_entry(tag, hash);
	}